

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaGlitch.c
# Opt level: O2

int Gli_ManCreateCi(Gli_Man_t *p,int nFanouts)

{
  Gli_Obj_t *pGVar1;
  
  pGVar1 = Gli_ObjAlloc(p,0,nFanouts);
  *(byte *)pGVar1 = *(byte *)pGVar1 | 1;
  Vec_IntPush(p->vCis,pGVar1->Handle);
  return pGVar1->Handle;
}

Assistant:

int Gli_ManCreateCi( Gli_Man_t * p, int nFanouts )
{
    Gli_Obj_t * pObj;
    pObj = Gli_ObjAlloc( p, 0, nFanouts );
    pObj->fTerm = 1;
    Vec_IntPush( p->vCis, pObj->Handle );
    return pObj->Handle;
}